

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_common.h
# Opt level: O0

uc_err uc_set_tlb(uc_struct_conflict15 *uc,int mode)

{
  int mode_local;
  uc_struct_conflict15 *uc_local;
  
  if (mode == 0) {
    uc->cpu->cc->tlb_fill = uc->cpu->cc->tlb_fill_cpu;
    uc_local._4_4_ = UC_ERR_OK;
  }
  else if (mode == 1) {
    uc->cpu->cc->tlb_fill = unicorn_fill_tlb_tricore;
    uc_local._4_4_ = UC_ERR_OK;
  }
  else {
    uc_local._4_4_ = UC_ERR_ARG;
  }
  return uc_local._4_4_;
}

Assistant:

static uc_err uc_set_tlb(struct uc_struct *uc, int mode) {
    switch (mode) {
        case UC_TLB_VIRTUAL:
            uc->cpu->cc->tlb_fill = unicorn_fill_tlb;
            return UC_ERR_OK;
        case UC_TLB_CPU:
            uc->cpu->cc->tlb_fill = uc->cpu->cc->tlb_fill_cpu;
            return UC_ERR_OK;
        default:
            return UC_ERR_ARG;
    }
}